

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Task<int> local_100 [2];
  int *local_e0;
  int *num;
  undefined1 local_d0 [4];
  int i;
  ThreadPool<int> pool;
  char **argv_local;
  int argc_local;
  
  pool._176_8_ = argv;
  ThreadPool<int>::ThreadPool((ThreadPool<int> *)local_d0,3,10);
  for (num._4_4_ = 0; num._4_4_ < 100; num._4_4_ = num._4_4_ + 1) {
    local_e0 = (int *)operator_new(4);
    *local_e0 = num._4_4_ + 100;
    Task<int>::Task(local_100,taskFunc,local_e0);
    ThreadPool<int>::addTask((ThreadPool<int> *)local_d0,local_100[0]);
  }
  sleep(0x1e);
  std::operator<<((ostream *)&std::cout,"-------exit---------------\n");
  ThreadPool<int>::~ThreadPool((ThreadPool<int> *)local_d0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    // 创建线程池
    ThreadPool<int> pool(3, 10);

    for (int i = 0; i < 100; i++)
    {
        int *num = new int(i + 100);

        pool.addTask(Task<int>(taskFunc, num));

    }

    sleep(30);  // 睡眠30秒

    cout<<"-------exit---------------\n";

    return 0;
}